

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::CollectSideEffectsForTarget
          (cmComputeTargetDepends *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *visited,
          size_t depender_index)

{
  pointer this_00;
  pointer pTVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_t sVar4;
  size_type sVar5;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_01;
  _Base_ptr p_Var6;
  cmGraphEdge *edge;
  pointer pcVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *sideEffects;
  size_t local_38;
  
  local_38 = depender_index;
  sVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (visited,&local_38);
  sVar4 = local_38;
  if (sVar5 == 0) {
    pTVar1 = (this->SideEffects).
             super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = pTVar1 + local_38;
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)visited,&local_38);
    cmGeneratorTarget::AppendCustomCommandSideEffects
              ((this->Targets).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_38],
               &this_00->CustomCommandSideEffects);
    sideEffects = &pTVar1[sVar4].LanguageSideEffects;
    cmGeneratorTarget::AppendLanguageSideEffects
              ((this->Targets).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_38],sideEffects);
    pcVar2 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = *(pointer *)
              ((long)&pcVar2[local_38].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar7 = *(pointer *)
                   &pcVar2[local_38].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pcVar7 != pcVar3;
        pcVar7 = pcVar7 + 1) {
      CollectSideEffectsForTarget(this,visited,pcVar7->Dest);
      pTVar1 = (this->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = pcVar7->Dest;
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)this_00,
                 *(_Base_ptr *)((long)&pTVar1[sVar4].CustomCommandSideEffects._M_t._M_impl + 0x18),
                 (_Base_ptr)((long)&pTVar1[sVar4].CustomCommandSideEffects._M_t._M_impl + 8));
      for (p_Var6 = *(_Base_ptr *)((long)&pTVar1[sVar4].LanguageSideEffects._M_t._M_impl + 0x18);
          p_Var6 != (_Rb_tree_node_base *)
                    ((long)&pTVar1[sVar4].LanguageSideEffects._M_t._M_impl + 8U);
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        this_01 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                     ::operator[](sideEffects,(key_type *)(p_Var6 + 1));
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                  (this_01,p_Var6[2]._M_right,
                   (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)&p_Var6[2]._M_parent);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffectsForTarget(
  std::set<size_t>& visited, size_t depender_index)
{
  if (!visited.count(depender_index)) {
    auto& se = this->SideEffects[depender_index];
    visited.insert(depender_index);
    this->Targets[depender_index]->AppendCustomCommandSideEffects(
      se.CustomCommandSideEffects);
    this->Targets[depender_index]->AppendLanguageSideEffects(
      se.LanguageSideEffects);

    for (auto const& edge : this->InitialGraph[depender_index]) {
      this->CollectSideEffectsForTarget(visited, edge);
      auto const& dse = this->SideEffects[edge];
      se.CustomCommandSideEffects.insert(dse.CustomCommandSideEffects.cbegin(),
                                         dse.CustomCommandSideEffects.cend());
      for (auto const& it : dse.LanguageSideEffects) {
        se.LanguageSideEffects[it.first].insert(it.second.cbegin(),
                                                it.second.cend());
      }
    }
  }
}